

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O2

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  int _h;
  uint _c;
  void *pvVar2;
  void *pvVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  int q;
  uint uVar6;
  ulong uVar7;
  int q_1;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float local_f4;
  int local_f0;
  int local_dc;
  Mat sqsum;
  Mat sum;
  Mat local_60;
  
  iVar8 = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  Mat::create(top_blob,iVar8,_h,_c,4);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  Mat::Mat(&sum,_c,4);
  local_dc = -100;
  if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
    uVar6 = _h * iVar8;
    uVar9 = 0;
    uVar7 = 0;
    if (0 < (int)uVar6) {
      uVar7 = (ulong)uVar6;
    }
    uVar4 = 0;
    if (0 < (int)_c) {
      uVar4 = (ulong)_c;
    }
    for (; uVar9 != uVar4; uVar9 = uVar9 + 1) {
      Mat::channel(&sqsum,bottom_blob,(int)uVar9);
      pvVar2 = sqsum.data;
      Mat::~Mat(&sqsum);
      fVar10 = 0.0;
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        fVar10 = fVar10 + *(float *)((long)pvVar2 + uVar5 * 4);
      }
      *(float *)((long)sum.data + uVar9 * 4) = fVar10;
    }
    local_f0 = (int)uVar4;
    if (this->across_channels == 0) {
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        Mat::channel(&sqsum,bottom_blob,(int)uVar9);
        pvVar2 = sqsum.data;
        Mat::~Mat(&sqsum);
        Mat::channel(&sqsum,top_blob,(int)uVar9);
        pvVar3 = sqsum.data;
        Mat::~Mat(&sqsum);
        fVar10 = *(float *)((long)sum.data + uVar9 * 4);
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          *(float *)((long)pvVar3 + uVar5 * 4) =
               *(float *)((long)pvVar2 + uVar5 * 4) - fVar10 * (1.0 / (float)(int)uVar6);
        }
      }
    }
    else {
      local_f4 = 0.0;
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        local_f4 = local_f4 + *(float *)((long)sum.data + uVar9 * 4);
      }
      for (iVar8 = 0; iVar8 != local_f0; iVar8 = iVar8 + 1) {
        Mat::channel(&sqsum,bottom_blob,iVar8);
        pvVar2 = sqsum.data;
        Mat::~Mat(&sqsum);
        Mat::channel(&sqsum,top_blob,iVar8);
        pvVar3 = sqsum.data;
        Mat::~Mat(&sqsum);
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar3 + uVar9 * 4) =
               *(float *)((long)pvVar2 + uVar9 * 4) - local_f4 / (float)(int)(_c * uVar6);
        }
      }
    }
    if (this->normalize_variance != 0) {
      Mat::Mat(&sqsum,_c,4);
      if ((sqsum.data == (void *)0x0) || ((long)sqsum.c * sqsum.cstep == 0)) {
        Mat::~Mat(&sqsum);
        goto LAB_0010e839;
      }
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        Mat::channel(&local_60,top_blob,(int)uVar9);
        pvVar2 = local_60.data;
        Mat::~Mat(&local_60);
        fVar10 = 0.0;
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          fVar1 = *(float *)((long)pvVar2 + uVar5 * 4);
          fVar10 = fVar10 + fVar1 * fVar1;
        }
        *(float *)((long)sqsum.data + uVar9 * 4) = fVar10;
      }
      if (this->across_channels == 0) {
        for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
          Mat::channel(&local_60,top_blob,(int)uVar9);
          pvVar2 = local_60.data;
          Mat::~Mat(&local_60);
          fVar10 = *(float *)((long)sqsum.data + uVar9 * 4);
          fVar1 = this->eps;
          for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar2 + uVar5 * 4) =
                 *(float *)((long)pvVar2 + uVar5 * 4) *
                 (1.0 / (SQRT(fVar10 * (1.0 / (float)(int)uVar6)) + fVar1));
          }
        }
      }
      else {
        fVar10 = 0.0;
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          fVar10 = fVar10 + *(float *)((long)sqsum.data + uVar9 * 4);
        }
        fVar1 = this->eps;
        for (iVar8 = 0; iVar8 != local_f0; iVar8 = iVar8 + 1) {
          Mat::channel(&local_60,top_blob,iVar8);
          pvVar2 = local_60.data;
          Mat::~Mat(&local_60);
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar2 + uVar9 * 4) =
                 *(float *)((long)pvVar2 + uVar9 * 4) *
                 (1.0 / (SQRT(fVar10 / (float)(int)(_c * uVar6)) + fVar1));
          }
        }
      }
      Mat::~Mat(&sqsum);
    }
    local_dc = 0;
  }
LAB_0010e839:
  Mat::~Mat(&sum);
  return local_dc;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    top_blob.create(w, h, channels);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels);
    if (sum.empty())
        return -100;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}